

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_env_infrastructure_reuse.hpp
# Opt level: O0

void __thiscall
so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>::
send_next_message(stats_controller_t<so_5::details::no_lock_holder_t> *this,duration pause,
                 int run_id)

{
  environment_t *env;
  outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>_>
  local_30;
  duration local_28;
  int local_1c;
  stats_controller_t<so_5::details::no_lock_holder_t> *psStack_18;
  int run_id_local;
  stats_controller_t<so_5::details::no_lock_holder_t> *this_local;
  duration pause_local;
  
  env = this->m_env;
  local_28.__r = pause.__r;
  local_1c = run_id;
  psStack_18 = this;
  this_local = (stats_controller_t<so_5::details::no_lock_holder_t> *)pause.__r;
  outliving_mutable<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>>
            ((so_5 *)&local_30,this);
  send_delayed<so_5::stats::impl::st_env_stuff::next_turn_handler_t::next_turn,so_5::outliving_reference_t<so_5::env_infrastructures::st_reusable_stuff::stats_controller_t<so_5::details::no_lock_holder_t>>,int_const&>
            (env,&this->m_next_turn_mbox,local_28,&local_30,&local_1c);
  return;
}

Assistant:

void
		send_next_message(
			std::chrono::steady_clock::duration pause,
			const int run_id )
			{
				send_delayed< next_turn >(
						m_env,
						m_next_turn_mbox,
						pause,
						outliving_mutable( *this ),
						run_id );
			}